

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_info_raw(stbi__jpeg *j,int *x,int *y,int *comp)

{
  int iVar1;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__jpeg *j_local;
  
  iVar1 = stbi__decode_jpeg_header(j,2);
  if (iVar1 == 0) {
    stbi__rewind(j->s);
    j_local._4_4_ = 0;
  }
  else {
    if (x != (int *)0x0) {
      *x = j->s->img_x;
    }
    if (y != (int *)0x0) {
      *y = j->s->img_y;
    }
    if (comp != (int *)0x0) {
      iVar1 = 1;
      if (2 < j->s->img_n) {
        iVar1 = 3;
      }
      *comp = iVar1;
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__jpeg_info_raw(stbi__jpeg *j, int *x, int *y, int *comp) {
  if (!stbi__decode_jpeg_header(j, STBI__SCAN_header)) {
    stbi__rewind(j->s);
    return 0;
  }
  if (x)
    *x = j->s->img_x;
  if (y)
    *y = j->s->img_y;
  if (comp)
    *comp = j->s->img_n >= 3 ? 3 : 1;
  return 1;
}